

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwht4x4_sse4_1(int16_t *input,tran_low_t *output,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  longlong *in_RSI;
  ulong *in_RDI;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  __m128i e1;
  __m128i d1;
  __m128i c1;
  __m128i b1;
  __m128i a1;
  int i;
  __m128i op [4];
  __m128i in [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  ulong local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  undefined8 uStack_2e0;
  longlong *local_2c8;
  ulong local_2b8;
  undefined8 uStack_2b0;
  ulong *local_2a0;
  ulong local_298;
  undefined8 uStack_290;
  ulong *local_280;
  ulong local_278;
  undefined8 uStack_270;
  ulong *local_260;
  ulong local_258;
  undefined8 uStack_250;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  
  local_318 = *in_RDI;
  uStack_250 = 0;
  uStack_310 = 0;
  local_260 = (ulong *)((long)in_RDI + (long)in_EDX * 2);
  local_308 = *local_260;
  uStack_270 = 0;
  uStack_300 = 0;
  local_280 = (ulong *)((long)in_RDI + (long)(in_EDX * 2) * 2);
  local_2f8 = *local_280;
  uStack_290 = 0;
  uStack_2f0 = 0;
  local_2a0 = (ulong *)((long)in_RDI + (long)(in_EDX * 3) * 2);
  local_2e8 = *local_2a0;
  uStack_2b0 = 0;
  uStack_2e0 = 0;
  local_208._8_8_ = 0;
  local_208._0_8_ = local_318;
  _local_358 = (__m128i)pmovsxwd(local_208,local_318);
  local_218._8_8_ = 0;
  local_218._0_8_ = local_308;
  local_348 = pmovsxwd(local_218,local_308);
  local_228._8_8_ = 0;
  local_228._0_8_ = local_2f8;
  local_338 = pmovsxwd(local_228,local_2f8);
  local_238._8_8_ = 0;
  local_238._0_8_ = local_2e8;
  local_328 = pmovsxwd(local_238,local_2e8);
  local_2c8 = in_RSI;
  local_2b8 = local_2e8;
  local_298 = local_2f8;
  local_278 = local_308;
  local_258 = local_318;
  for (local_35c = 0; local_1c8._0_4_ = local_358._0_4_, iVar5 = (int)local_1c8,
      local_1c8._4_4_ = local_358._4_4_, iVar9 = local_1c8._4_4_, uStack_1c0._0_4_ = local_358._8_4_
      , iVar13 = (int)uStack_1c0, uStack_1c0._4_4_ = local_358._12_4_, iVar17 = uStack_1c0._4_4_,
      local_1d8._4_4_ = local_348._4_4_, iVar12 = local_1d8._4_4_,
      uStack_1d0._4_4_ = local_348._12_4_, iVar20 = uStack_1d0._4_4_,
      local_128._0_4_ = local_328._0_4_, iVar6 = (int)local_128, local_128._4_4_ = local_328._4_4_,
      iVar10 = local_128._4_4_, uStack_120._0_4_ = local_328._8_4_, iVar14 = (int)uStack_120,
      uStack_120._4_4_ = local_328._12_4_, iVar18 = uStack_120._4_4_,
      local_138._4_4_ = local_338._4_4_, iVar2 = local_138._4_4_,
      uStack_130._4_4_ = local_338._12_4_, iVar4 = uStack_130._4_4_,
      local_1d8._0_4_ = local_348._0_4_, iVar8 = (int)local_1d8, uStack_1d0._0_4_ = local_348._8_4_,
      iVar16 = (int)uStack_1d0, local_138._0_4_ = local_338._0_4_, iVar1 = (int)local_138,
      uStack_130._0_4_ = local_338._8_4_, iVar3 = (int)uStack_130, local_35c < 2;
      local_35c = local_35c + 1) {
    local_1c8 = (longlong)local_358;
    uStack_1c0 = uStack_350;
    local_1d8 = local_348._0_8_;
    uStack_1d0 = local_348._8_8_;
    iVar5 = iVar5 + iVar8;
    iVar9 = iVar9 + iVar12;
    iVar13 = iVar13 + iVar16;
    iVar17 = iVar17 + iVar20;
    local_378 = CONCAT44(iVar9,iVar5);
    uStack_370 = CONCAT44(iVar17,iVar13);
    local_128 = local_328._0_8_;
    uStack_120 = local_328._8_8_;
    local_138 = local_338._0_8_;
    uStack_130 = local_338._8_8_;
    iVar6 = iVar6 - iVar1;
    iVar10 = iVar10 - iVar2;
    iVar14 = iVar14 - iVar3;
    iVar18 = iVar18 - iVar4;
    local_3a8 = CONCAT44(iVar10,iVar6);
    uStack_3a0 = CONCAT44(iVar18,iVar14);
    local_148 = local_378;
    uStack_140 = uStack_370;
    local_158 = local_3a8;
    uStack_150 = uStack_3a0;
    local_108 = CONCAT44(iVar9 - iVar10,iVar5 - iVar6);
    uStack_100 = CONCAT44(iVar17 - iVar18,iVar13 - iVar14);
    local_10c = 1;
    auVar21 = ZEXT416(1);
    iVar7 = iVar5 - iVar6 >> auVar21;
    iVar11 = iVar9 - iVar10 >> auVar21;
    iVar15 = iVar13 - iVar14 >> auVar21;
    iVar19 = iVar17 - iVar18 >> auVar21;
    local_168 = CONCAT44(iVar11,iVar7);
    uStack_160 = CONCAT44(iVar19,iVar15);
    local_178 = local_348._0_8_;
    uStack_170 = local_348._8_8_;
    iVar8 = iVar7 - iVar8;
    iVar12 = iVar11 - iVar12;
    iVar16 = iVar15 - iVar16;
    iVar20 = iVar19 - iVar20;
    local_388 = CONCAT44(iVar12,iVar8);
    uStack_380 = CONCAT44(iVar20,iVar16);
    local_188 = CONCAT44(iVar11,iVar7);
    uStack_180 = CONCAT44(iVar19,iVar15);
    local_198 = local_338._0_8_;
    uStack_190 = local_338._8_8_;
    iVar7 = iVar7 - iVar1;
    iVar11 = iVar11 - iVar2;
    iVar15 = iVar15 - iVar3;
    iVar19 = iVar19 - iVar4;
    local_398 = CONCAT44(iVar11,iVar7);
    uStack_390 = CONCAT44(iVar19,iVar15);
    local_1a8 = local_378;
    uStack_1a0 = uStack_370;
    local_1b8 = local_398;
    uStack_1b0 = uStack_390;
    local_378 = CONCAT44(iVar9 - iVar11,iVar5 - iVar7);
    uStack_370 = CONCAT44(iVar17 - iVar19,iVar13 - iVar15);
    local_1e8 = local_3a8;
    uStack_1e0 = uStack_3a0;
    local_1f8 = local_388;
    uStack_1f0 = uStack_380;
    local_3a8 = CONCAT44(iVar10 + iVar12,iVar6 + iVar8);
    uStack_3a0 = CONCAT44(iVar18 + iVar20,iVar14 + iVar16);
    uStack_350 = uStack_370;
    local_358 = (undefined1  [8])local_378;
    local_348._8_8_ = uStack_390;
    local_348._0_8_ = local_398;
    local_338._8_8_ = uStack_3a0;
    local_338._0_8_ = local_3a8;
    local_328._8_8_ = uStack_380;
    local_328._0_8_ = local_388;
    if (local_35c == 0) {
      transpose_32bit_4x4((__m128i *)local_358,(__m128i *)local_358);
    }
  }
  local_358._4_4_ = local_1c8._4_4_;
  local_358._0_4_ = (int)local_1c8 << 2;
  uStack_350._0_4_ = (int)uStack_1c0;
  uStack_350._4_4_ = uStack_1c0._4_4_;
  local_348._4_4_ = local_1d8._4_4_;
  local_348._0_4_ = (int)local_1d8 << 2;
  local_348._8_4_ = (int)uStack_1d0;
  local_348._12_4_ = uStack_1d0._4_4_;
  local_338._4_4_ = local_138._4_4_;
  local_338._0_4_ = (int)local_138 << 2;
  local_338._8_4_ = (int)uStack_130;
  local_338._12_4_ = uStack_130._4_4_;
  local_328._4_4_ = local_128._4_4_;
  local_328._0_4_ = (int)local_128 << 2;
  local_328._8_4_ = (int)uStack_120;
  local_328._12_4_ = uStack_120._4_4_;
  *local_2c8 = (longlong)local_358;
  local_2c8[1] = uStack_350;
  local_2c8[2] = local_348._0_8_;
  local_2c8[3] = local_348._8_8_;
  local_2c8[4] = local_338._0_8_;
  local_2c8[5] = local_338._8_8_;
  local_2c8[6] = local_328._0_8_;
  local_2c8[7] = local_328._8_8_;
  return;
}

Assistant:

void av1_fwht4x4_sse4_1(const int16_t *input, tran_low_t *output, int stride) {
  __m128i in[4];
  in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
  in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));

  // Convert to int32_t.
  __m128i op[4];
  op[0] = _mm_cvtepi16_epi32(in[0]);
  op[1] = _mm_cvtepi16_epi32(in[1]);
  op[2] = _mm_cvtepi16_epi32(in[2]);
  op[3] = _mm_cvtepi16_epi32(in[3]);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i b1 = op[1];
    __m128i c1 = op[2];
    __m128i d1 = op[3];
    __m128i e1;

    a1 = _mm_add_epi32(a1, b1);  // a1 += b1
    d1 = _mm_sub_epi32(d1, c1);  // d1 = d1 - c1
    e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, c1);  // a1 -= c1
    d1 = _mm_add_epi32(d1, b1);  // d1 += b1

    op[0] = a1;
    op[1] = c1;
    op[2] = d1;
    op[3] = b1;

    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  op[0] = _mm_slli_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_slli_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_slli_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_slli_epi32(op[3], UNIT_QUANT_SHIFT);

  _mm_storeu_si128((__m128i *)(output + 0), op[0]);
  _mm_storeu_si128((__m128i *)(output + 4), op[1]);
  _mm_storeu_si128((__m128i *)(output + 8), op[2]);
  _mm_storeu_si128((__m128i *)(output + 12), op[3]);
}